

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O1

void chrono::fea::rotutils::RotCo<chrono::ChVector<double>,double>
               (int cid,ChVector<double> *phi,ChVector<double> *p,double *cf)

{
  long lVar1;
  undefined8 *puVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double phip [10];
  double local_68 [11];
  
  auVar6._8_8_ = 0;
  auVar6._0_8_ = phi->m_data[0];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = phi->m_data[1] * phi->m_data[1];
  auVar18 = vfmadd231sd_fma(auVar17,auVar6,auVar6);
  dVar13 = phi->m_data[2];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = p->m_data[0];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = p->m_data[1] * p->m_data[1];
  auVar6 = vfmadd231sd_fma(auVar11,auVar7,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = p->m_data[2];
  auVar6 = vfmadd213sd_fma(auVar8,auVar8,auVar6);
  if (auVar6._0_8_ < 0.0) {
    dVar5 = sqrt(auVar6._0_8_);
    auVar18._8_8_ = 0;
  }
  else {
    auVar6 = vsqrtsd_avx(auVar6,auVar6);
    dVar5 = auVar6._0_8_;
  }
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar13;
  auVar6 = vfmadd213sd_fma(auVar14,auVar14,auVar18);
  dVar13 = auVar6._0_8_;
  if (*(double *)(&DAT_009e04a8 + (long)cid * 8) <= dVar5) {
    if (dVar13 < 0.0) {
      dVar5 = sqrt(dVar13);
    }
    else {
      auVar6 = vsqrtsd_avx(auVar6,auVar6);
      dVar5 = auVar6._0_8_;
    }
    dVar4 = sin(dVar5);
    *cf = dVar4 / dVar5;
    if (cid != 1) {
      dVar5 = cos(dVar5);
      auVar9._0_8_ = (1.0 - dVar5) / dVar13;
      auVar9._8_8_ = 0;
      cf[1] = auVar9._0_8_;
      if (cid != 2) {
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *cf;
        auVar12._0_8_ = (1.0 - *cf) / dVar13;
        auVar12._8_8_ = 0;
        cf[2] = auVar12._0_8_;
        if (cid != 3) {
          auVar6 = vfmadd231sd_fma(auVar15,auVar9,ZEXT816(0xc000000000000000));
          auVar16._0_8_ = auVar6._0_8_ / dVar13;
          auVar16._8_8_ = auVar6._8_8_;
          cf[3] = auVar16._0_8_;
          if (cid != 4) {
            auVar6 = vfmadd213sd_fma(ZEXT816(0xc008000000000000),auVar12,auVar9);
            cf[4] = auVar6._0_8_ / dVar13;
            if (cid != 5) {
              auVar10._8_8_ = 0;
              auVar10._0_8_ = auVar12._0_8_ - auVar9._0_8_;
              auVar6 = vfmadd231sd_fma(auVar10,auVar16,ZEXT816(0xc010000000000000));
              cf[5] = auVar6._0_8_ / dVar13;
            }
          }
        }
      }
    }
  }
  else {
    local_68[0] = 1.0;
    lVar1 = 1;
    dVar5 = 1.0;
    do {
      dVar5 = dVar13 * dVar5;
      local_68[lVar1] = dVar5;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 10);
    if (0 < cid) {
      puVar2 = &SerCoeff;
      uVar3 = 0;
      do {
        cf[uVar3] = 0.0;
        dVar13 = 0.0;
        lVar1 = 0;
        do {
          dVar13 = dVar13 + local_68[lVar1] / (double)puVar2[lVar1];
          lVar1 = lVar1 + 1;
        } while ((double)(int)lVar1 < (double)(&SerTrunc)[uVar3]);
        cf[uVar3] = dVar13;
        uVar3 = uVar3 + 1;
        puVar2 = puVar2 + 9;
      } while (uVar3 != (uint)cid);
    }
  }
  return;
}

Assistant:

void RotCo(const int cid, const T1& phi, const ChVector<>& p, T2* const cf) {
    T2 phip[10];
    T2 phi2(phi ^ phi);
    double mp(p.Length());  // (sqrt(p.Dot()));
    int k, j;

    if (mp < SerThrsh[cid - 1]) {
        phip[0] = 1.;
        for (j = 1; j <= 9; j++) {
            phip[j] = phip[j - 1] * phi2;
        }
        for (k = 0; k < cid; k++) {
            cf[k] = 0.;
            for (j = 0; j < SerTrunc[k]; j++) {
                cf[k] += phip[j] / SerCoeff[k][j];
            }
        }

        return;
    }

    const T2 ID(1.);
    T2 pd(sqrt(phi2));
    cf[0] = sin(pd) / pd;  // a = sin(phi)/phi
    if (cid == 1)
        return;
    cf[1] = (ID - cos(pd)) / phi2;  // b = (1.-cos(phi))/phi2
    if (cid == 2)
        return;
    cf[2] = (ID - cf[0]) / phi2;  // c = (1.-a)/phi2
    if (cid == 3)
        return;
    cf[3] = (cf[0] - (cf[1] * 2.)) / phi2;  // d = (a-2*b)/phi2
    if (cid == 4)
        return;
    cf[4] = (cf[1] - (cf[2] * 3.)) / phi2;  // e = (b-3*c)/phi2
    if (cid == 5)
        return;
    cf[5] = (cf[2] - cf[1] - (cf[3] * 4.)) / phi2;  // f = (c-b-4*d)/phi2
    // if (cid == 6) return; inutile
    return;
}